

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
          (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *this,
          small_vector<float,_4UL,_0UL,_std::allocator<float>_> *v,allocator<float> *alloc)

{
  float *pfVar1;
  size_t sVar2;
  pointer pfVar3;
  size_type __n;
  
  this->m_dynamic_capacity = 0;
  this->m_dynamic_data = (pointer)0x0;
  __n = (long)v->m_end - (long)v->m_begin >> 2;
  if (__n < 5) {
    this->m_end = (pointer)this->m_static_data;
    this->m_begin = (pointer)this->m_static_data;
    sVar2 = 4;
  }
  else {
    this->m_dynamic_capacity = __n;
    pfVar1 = __gnu_cxx::new_allocator<float>::allocate((new_allocator<float> *)this,__n,(void *)0x0)
    ;
    this->m_dynamic_data = pfVar1;
    this->m_end = pfVar1;
    this->m_begin = pfVar1;
    sVar2 = (long)v->m_end - (long)v->m_begin >> 2;
  }
  this->m_capacity = sVar2;
  for (pfVar3 = v->m_begin; pfVar3 != v->m_end; pfVar3 = pfVar3 + 1) {
    pfVar1 = this->m_end;
    *pfVar1 = *pfVar3;
    this->m_end = pfVar1 + 1;
  }
  return;
}

Assistant:

small_vector(const small_vector& v, const Alloc& alloc)
        : m_alloc(alloc)
        , m_dynamic_capacity(0)
        , m_dynamic_data(nullptr)
    {
        if (v.size() > StaticCapacity)
        {
            m_dynamic_capacity = v.size();
            m_begin = m_end = m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
            m_capacity = v.size();
        }
        else
        {
            m_begin = m_end = static_begin_ptr();
            m_capacity = StaticCapacity;
        }

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }
    }